

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make.c
# Opt level: O1

Expr make_int_zero(pExecutor exec)

{
  pLongInt value;
  Expr EVar1;
  
  value = longint_zero();
  if (value != (pLongInt)0x0) {
    EVar1 = make_int(exec,value);
    free_longint(value);
    EVar1._4_4_ = 0;
    return EVar1;
  }
  puts("make_int_zero: longint_zero failed");
  exit(1);
}

Assistant:

Expr make_int_zero(pExecutor exec)
{
    pLongInt num = longint_zero();
    if (num == NULL)
    {
        log("make_int_zero: longint_zero failed");
        exit(1);
    }
    Expr res = make_int(exec, num);
    free_longint(num);
    return res;
}